

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeConcepts.hh
# Opt level: O3

shared_ptr<avro::Node> * __thiscall
avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>::get
          (NoAttribute<boost::shared_ptr<avro::Node>_> *this,size_t index)

{
  undefined8 *puVar1;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x18);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"This type does not have attribute","");
  std::runtime_error::runtime_error((runtime_error *)(puVar1 + 1),(string *)local_40);
  *puVar1 = 0x17fa60;
  puVar1[1] = 0x17fa90;
  __cxa_throw(puVar1,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

const Attribute &get(size_t index = 0) const {
        // There must be an get function for the generic NodeImpl, but the
        // Node APIs ensure that it is never called, the throw here is
        // just in case
        throw Exception("This type does not have attribute");
        // even though this code is unreachable the compiler requires it
        static const Attribute empty = Attribute();
        return empty;
    }